

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cascade.cpp
# Opt level: O0

void __thiscall Iir::Cascade::setLayout(Cascade *this,LayoutBase *proto)

{
  int iVar1;
  LayoutBase *in_RSI;
  int *in_RDI;
  Cascade *this_00;
  PoleZeroPair *in_stack_00000008;
  Biquad *in_stack_00000010;
  int i_1;
  int i;
  Biquad *stage;
  int numPoles;
  double in_stack_000000a8;
  Cascade *in_stack_000000b0;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  LayoutBase *in_stack_ffffffffffffffb0;
  int local_28;
  int local_24;
  
  iVar1 = LayoutBase::getNumPoles(in_RSI);
  *in_RDI = (iVar1 + 1) / 2;
  if (in_RDI[1] < *in_RDI) {
    throw_invalid_argument((char *)in_RDI);
  }
  for (local_24 = 0; local_24 < in_RDI[1]; local_24 = local_24 + 1) {
    Biquad::setIdentity((Biquad *)0x1044cd);
  }
  for (local_28 = 0; local_28 < *in_RDI; local_28 = local_28 + 1) {
    LayoutBase::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    Biquad::setPoleZeroPair(in_stack_00000010,in_stack_00000008);
  }
  this_00 = (Cascade *)LayoutBase::getNormalGain(in_RSI);
  LayoutBase::getNormalW(in_RSI);
  response(in_stack_000000b0,in_stack_000000a8);
  std::abs<double>((complex<double> *)this_00);
  applyScale(this_00,(double)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  return;
}

Assistant:

void Cascade::setLayout (const LayoutBase& proto)
	{
		const int numPoles = proto.getNumPoles();
		m_numStages = (numPoles + 1)/ 2;
		if (m_numStages > m_maxStages)
			throw_invalid_argument("Number of stages is larger than the max stages.");

		Biquad* stage = m_stageArray;
		for (int i = 0; i < m_maxStages; ++i, ++stage)
			stage->setIdentity();
  
		stage = m_stageArray;
		for (int i = 0; i < m_numStages; ++i, ++stage)
			stage->setPoleZeroPair (proto[i]);
  
		applyScale (proto.getNormalGain() /
			    std::abs (response (proto.getNormalW() / (2 * doublePi))));
	}